

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O2

void __thiscall
google::protobuf::UnknownFieldSet::MergeFromAndDestroy(UnknownFieldSet *this,UnknownFieldSet *other)

{
  pointer pUVar1;
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar2;
  uint uVar3;
  long lVar4;
  _Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
  *this_00;
  
  this_00 = &other->fields_->
             super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
  ;
  if (this_00 ==
      (_Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
       *)0x0) {
LAB_003326e7:
    this_00 = (_Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
               *)0x0;
  }
  else {
    uVar3 = (uint)((ulong)((long)(((_Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                                    *)&this_00->_M_impl)->_M_impl).super__Vector_impl_data._M_finish
                          - (long)(((_Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                                     *)&this_00->_M_impl)->_M_impl).super__Vector_impl_data._M_start
                          ) >> 4);
    if (0 < (int)uVar3) {
      if (this->fields_ ==
          (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *
          )0x0) {
        pvVar2 = (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                  *)operator_new(0x18);
        (pvVar2->
        super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
        )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (pvVar2->
        super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
        )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (pvVar2->
        super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        this->fields_ = pvVar2;
      }
      for (lVar4 = 0; (ulong)(uVar3 & 0x7fffffff) << 4 != lVar4; lVar4 = lVar4 + 0x10) {
        std::vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
        ::push_back(this->fields_,
                    (value_type *)
                    ((long)&((other->fields_->
                             super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                             )._M_impl.super__Vector_impl_data._M_start)->number_ + lVar4));
        pUVar1 = (other->fields_->
                 super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        if (*(int *)((long)&pUVar1->type_ + lVar4) - 3U < 2) {
          *(undefined8 *)((long)&pUVar1->data_ + lVar4) = 0;
        }
      }
      this_00 = &other->fields_->
                 super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      ;
      if (this_00 ==
          (_Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
           *)0x0) goto LAB_003326e7;
    }
    std::
    _Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>::
    ~_Vector_base(this_00);
  }
  operator_delete(this_00,0x18);
  other->fields_ =
       (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *)
       0x0;
  return;
}

Assistant:

void UnknownFieldSet::MergeFromAndDestroy(UnknownFieldSet* other) {
  int other_field_count = other->field_count();
  if (other_field_count > 0) {
    if (fields_ == NULL) fields_ = new std::vector<UnknownField>();
    for (int i = 0; i < other_field_count; i++) {
      fields_->push_back((*other->fields_)[i]);
      (*other->fields_)[i].Reset();
    }
  }
  delete other->fields_;
  other->fields_ = NULL;
}